

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palobjbase.hpp
# Opt level: O0

void __thiscall CorUnix::CPalObjectBase::CPalObjectBase(CPalObjectBase *this,CObjectType *pot)

{
  CObjectType *pot_local;
  CPalObjectBase *this_local;
  
  IPalObject::IPalObject(&this->super_IPalObject);
  (this->super_IPalObject)._vptr_IPalObject = (_func_int **)&PTR_GetObjectType_001d2560;
  this->m_lRefCount = 1;
  this->m_pvImmutableData = (VOID *)0x0;
  this->m_pvLocalData = (VOID *)0x0;
  this->m_pot = pot;
  CObjectAttributes::CObjectAttributes(&this->m_oa);
  CSimpleDataLock::CSimpleDataLock(&this->m_sdlLocalData);
  this->m_pthrCleanup = (CPalThread *)0x0;
  return;
}

Assistant:

CPalObjectBase(
            CObjectType *pot
            )
            :
            m_lRefCount(1),
            m_pvImmutableData(NULL),
            m_pvLocalData(NULL),
            m_pot(pot),
            m_pthrCleanup(NULL)
        {
        }